

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_muldiv(DisasContext_conflict6 *ctx,uint32_t opc,int acc,int rs,int rt)

{
  TCGContext_conflict6 *s;
  TCGTemp *pTVar1;
  TCGTemp *a1;
  TCGTemp *pTVar2;
  TCGTemp *pTVar3;
  TCGv_i64 pTVar4;
  TCGv_i64 pTVar5;
  TCGv_i64 pTVar6;
  uintptr_t o_9;
  TCGOpcode TVar7;
  TCGv_i32 ret;
  uintptr_t o_2;
  TCGv_i64 ret_00;
  TCGv_i32 ret_01;
  uintptr_t o_5;
  uintptr_t o_3;
  TCGTemp *local_58;
  TCGTemp *local_50;
  
  s = ctx->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)pTVar1 - (long)s);
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  if (rs == 0) {
    TVar7 = INDEX_op_movi_i64;
    pTVar5 = (TCGv_i64)0x0;
LAB_009a3a0e:
    tcg_gen_op2_mips64el(s,TVar7,(TCGArg)pTVar1,(TCGArg)pTVar5);
  }
  else if (s->cpu_gpr[rs] != ret_00) {
    pTVar5 = s->cpu_gpr[rs] + (long)s;
    TVar7 = INDEX_op_mov_i64;
    goto LAB_009a3a0e;
  }
  pTVar5 = (TCGv_i64)((long)a1 - (long)s);
  if (rt == 0) {
    TVar7 = INDEX_op_movi_i64;
    pTVar6 = (TCGv_i64)0x0;
LAB_009a3a4f:
    tcg_gen_op2_mips64el(s,TVar7,(TCGArg)a1,(TCGArg)pTVar6);
  }
  else if (s->cpu_gpr[rt] != pTVar5) {
    pTVar6 = s->cpu_gpr[rt] + (long)s;
    TVar7 = INDEX_op_mov_i64;
    goto LAB_009a3a4f;
  }
  if ((acc != 0) && ((ctx->hflags & 0x80000) == 0)) {
    gen_muldiv_cold_1();
  }
  switch(opc) {
  case 0x18:
    local_50 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    ret = (TCGv_i32)((long)local_50 - (long)s);
    local_58 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    ret_01 = (TCGv_i32)((long)local_58 - (long)s);
    tcg_gen_extrl_i64_i32_mips64el(s,ret,ret_00);
    tcg_gen_extrl_i64_i32_mips64el(s,ret_01,pTVar5);
    tcg_gen_muls2_i32_mips64el(s,ret,ret_01,ret,ret_01);
    break;
  case 0x19:
    local_50 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    ret = (TCGv_i32)((long)local_50 - (long)s);
    local_58 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    ret_01 = (TCGv_i32)((long)local_58 - (long)s);
    tcg_gen_extrl_i64_i32_mips64el(s,ret,ret_00);
    tcg_gen_extrl_i64_i32_mips64el(s,ret_01,pTVar5);
    tcg_gen_mulu2_i32_mips64el(s,ret,ret_01,ret,ret_01);
    break;
  case 0x1a:
    local_50 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar4 = (TCGv_i64)((long)local_50 - (long)s);
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar6 = (TCGv_i64)((long)pTVar1 - (long)s);
    tcg_gen_ext32s_i64_mips64el(s,ret_00,ret_00);
    tcg_gen_ext32s_i64_mips64el(s,pTVar5,pTVar5);
    tcg_gen_setcondi_i64_mips64el(s,TCG_COND_EQ,pTVar4,ret_00,-0x80000000);
    tcg_gen_setcondi_i64_mips64el(s,TCG_COND_EQ,pTVar6,pTVar5,-1);
    tcg_gen_op3_mips64el(s,INDEX_op_and_i64,(TCGArg)local_50,(TCGArg)local_50,(TCGArg)pTVar1);
    tcg_gen_setcondi_i64_mips64el(s,TCG_COND_EQ,pTVar6,pTVar5,0);
    tcg_gen_op3_mips64el(s,INDEX_op_or_i64,(TCGArg)local_50,(TCGArg)local_50,(TCGArg)pTVar1);
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar1,0);
    tcg_gen_movcond_i64_mips64el(s,TCG_COND_NE,pTVar5,pTVar4,pTVar6,pTVar4,pTVar5);
    tcg_gen_div_i64_mips64el(s,s->cpu_LO[(uint)acc],ret_00,pTVar5);
    tcg_gen_rem_i64_mips64el(s,s->cpu_HI[(uint)acc],ret_00,pTVar5);
    tcg_gen_ext32s_i64_mips64el(s,s->cpu_LO[(uint)acc],s->cpu_LO[(uint)acc]);
    tcg_gen_ext32s_i64_mips64el(s,s->cpu_HI[(uint)acc],s->cpu_HI[(uint)acc]);
    goto LAB_009a4418;
  case 0x1b:
    pTVar6 = tcg_const_i64_mips64el(s,0);
    pTVar4 = tcg_const_i64_mips64el(s,1);
    tcg_gen_ext32u_i64_mips64el(s,ret_00,ret_00);
    tcg_gen_ext32u_i64_mips64el(s,pTVar5,pTVar5);
    tcg_gen_movcond_i64_mips64el(s,TCG_COND_EQ,pTVar5,pTVar5,pTVar6,pTVar4,pTVar5);
    tcg_gen_divu_i64_mips64el(s,s->cpu_LO[(uint)acc],ret_00,pTVar5);
    tcg_gen_remu_i64_mips64el(s,s->cpu_HI[(uint)acc],ret_00,pTVar5);
    tcg_gen_ext32s_i64_mips64el(s,s->cpu_LO[(uint)acc],s->cpu_LO[(uint)acc]);
    tcg_gen_ext32s_i64_mips64el(s,s->cpu_HI[(uint)acc],s->cpu_HI[(uint)acc]);
    goto LAB_009a41fe;
  case 0x1c:
    tcg_gen_muls2_i64_mips64el(s,s->cpu_LO[(uint)acc],s->cpu_HI[(uint)acc],ret_00,pTVar5);
    goto LAB_009a4448;
  case 0x1d:
    tcg_gen_mulu2_i64_mips64el(s,s->cpu_LO[(uint)acc],s->cpu_HI[(uint)acc],ret_00,pTVar5);
    goto LAB_009a4448;
  case 0x1e:
    local_50 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar6 = (TCGv_i64)((long)local_50 - (long)s);
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar4 = (TCGv_i64)((long)pTVar1 - (long)s);
    tcg_gen_setcondi_i64_mips64el(s,TCG_COND_EQ,pTVar6,ret_00,-0x8000000000000000);
    tcg_gen_setcondi_i64_mips64el(s,TCG_COND_EQ,pTVar4,pTVar5,-1);
    tcg_gen_op3_mips64el(s,INDEX_op_and_i64,(TCGArg)local_50,(TCGArg)local_50,(TCGArg)pTVar1);
    tcg_gen_setcondi_i64_mips64el(s,TCG_COND_EQ,pTVar4,pTVar5,0);
    tcg_gen_op3_mips64el(s,INDEX_op_or_i64,(TCGArg)local_50,(TCGArg)local_50,(TCGArg)pTVar1);
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar1,0);
    tcg_gen_movcond_i64_mips64el(s,TCG_COND_NE,pTVar5,pTVar6,pTVar4,pTVar6,pTVar5);
    tcg_gen_div_i64_mips64el(s,s->cpu_LO[(uint)acc],ret_00,pTVar5);
    tcg_gen_rem_i64_mips64el(s,s->cpu_HI[(uint)acc],ret_00,pTVar5);
LAB_009a4418:
    tcg_temp_free_internal_mips64el(s,pTVar1);
    goto LAB_009a442b;
  case 0x1f:
    pTVar6 = tcg_const_i64_mips64el(s,0);
    pTVar4 = tcg_const_i64_mips64el(s,1);
    tcg_gen_movcond_i64_mips64el(s,TCG_COND_EQ,pTVar5,pTVar5,pTVar6,pTVar4,pTVar5);
    tcg_gen_divu_i64_mips64el(s,s->cpu_LO[(uint)acc],ret_00,pTVar5);
    tcg_gen_remu_i64_mips64el(s,s->cpu_HI[(uint)acc],ret_00,pTVar5);
LAB_009a41fe:
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar4 + (long)s));
    local_50 = (TCGTemp *)(pTVar6 + (long)s);
    goto LAB_009a442b;
  default:
    switch(opc) {
    case 0x70000000:
      pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      if (pTVar2 != pTVar1) {
        tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar2,(TCGArg)pTVar1);
      }
      pTVar4 = (TCGv_i64)((long)pTVar2 - (long)s);
      pTVar6 = (TCGv_i64)((long)pTVar3 - (long)s);
      if (pTVar3 != a1) {
        tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar3,(TCGArg)a1);
      }
      tcg_gen_op3_mips64el(s,INDEX_op_mul_i64,(TCGArg)pTVar2,(TCGArg)pTVar2,(TCGArg)pTVar3);
      tcg_gen_deposit_i64_mips64el(s,pTVar6,s->cpu_LO[(uint)acc],s->cpu_HI[(uint)acc],0x20,0x20);
      tcg_gen_op3_mips64el(s,INDEX_op_add_i64,(TCGArg)pTVar2,(TCGArg)pTVar2,(TCGArg)pTVar3);
      goto LAB_009a3ccf;
    case 0x70000001:
      pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      tcg_gen_ext32u_i64_mips64el(s,ret_00,ret_00);
      tcg_gen_ext32u_i64_mips64el(s,pTVar5,pTVar5);
      if (pTVar2 != pTVar1) {
        tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar2,(TCGArg)pTVar1);
      }
      pTVar4 = (TCGv_i64)((long)pTVar2 - (long)s);
      pTVar6 = (TCGv_i64)((long)pTVar3 - (long)s);
      if (pTVar3 != a1) {
        tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar3,(TCGArg)a1);
      }
      tcg_gen_op3_mips64el(s,INDEX_op_mul_i64,(TCGArg)pTVar2,(TCGArg)pTVar2,(TCGArg)pTVar3);
      tcg_gen_deposit_i64_mips64el(s,pTVar6,s->cpu_LO[(uint)acc],s->cpu_HI[(uint)acc],0x20,0x20);
      tcg_gen_op3_mips64el(s,INDEX_op_add_i64,(TCGArg)pTVar2,(TCGArg)pTVar2,(TCGArg)pTVar3);
LAB_009a3ccf:
      tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar6 + (long)s));
      tcg_gen_ext32s_i64_mips64el(s,s->cpu_LO[(uint)acc],pTVar4);
      tcg_gen_sari_i64_mips64el(s,s->cpu_HI[(uint)acc],pTVar4,0x20);
      tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar4 + (long)s));
      break;
    default:
      generate_exception_err(ctx,0x14,0);
      break;
    case 0x70000004:
      pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      if (pTVar2 != pTVar1) {
        tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar2,(TCGArg)pTVar1);
      }
      pTVar6 = (TCGv_i64)((long)pTVar2 - (long)s);
      pTVar4 = (TCGv_i64)((long)pTVar3 - (long)s);
      if (pTVar3 != a1) {
        tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar3,(TCGArg)a1);
      }
      tcg_gen_op3_mips64el(s,INDEX_op_mul_i64,(TCGArg)pTVar2,(TCGArg)pTVar2,(TCGArg)pTVar3);
      tcg_gen_deposit_i64_mips64el(s,pTVar4,s->cpu_LO[(uint)acc],s->cpu_HI[(uint)acc],0x20,0x20);
      tcg_gen_sub_i64(s,pTVar6,pTVar4,pTVar6);
      tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar4 + (long)s));
      tcg_gen_ext32s_i64_mips64el(s,s->cpu_LO[(uint)acc],pTVar6);
      tcg_gen_sari_i64_mips64el(s,s->cpu_HI[(uint)acc],pTVar6,0x20);
      tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar6 + (long)s));
      break;
    case 0x70000005:
      pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      tcg_gen_ext32u_i64_mips64el(s,ret_00,ret_00);
      tcg_gen_ext32u_i64_mips64el(s,pTVar5,pTVar5);
      if (pTVar2 != pTVar1) {
        tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar2,(TCGArg)pTVar1);
      }
      pTVar4 = (TCGv_i64)((long)pTVar2 - (long)s);
      pTVar6 = (TCGv_i64)((long)pTVar3 - (long)s);
      if (pTVar3 != a1) {
        tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar3,(TCGArg)a1);
      }
      tcg_gen_op3_mips64el(s,INDEX_op_mul_i64,(TCGArg)pTVar2,(TCGArg)pTVar2,(TCGArg)pTVar3);
      tcg_gen_deposit_i64_mips64el(s,pTVar6,s->cpu_LO[(uint)acc],s->cpu_HI[(uint)acc],0x20,0x20);
      tcg_gen_sub_i64(s,pTVar4,pTVar6,pTVar4);
      tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar6 + (long)s));
      tcg_gen_ext32s_i64_mips64el(s,s->cpu_LO[(uint)acc],pTVar4);
      tcg_gen_sari_i64_mips64el(s,s->cpu_HI[(uint)acc],pTVar4,0x20);
      tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar4 + (long)s));
    }
    goto LAB_009a4448;
  }
  tcg_gen_ext_i32_i64_mips64el(s,s->cpu_LO[(uint)acc],ret);
  tcg_gen_ext_i32_i64_mips64el(s,s->cpu_HI[(uint)acc],ret_01);
  tcg_temp_free_internal_mips64el(s,local_50);
  local_50 = local_58;
LAB_009a442b:
  tcg_temp_free_internal_mips64el(s,local_50);
LAB_009a4448:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(ret_00 + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar5 + (long)s));
  return;
}

Assistant:

static void gen_muldiv(DisasContext *ctx, uint32_t opc,
                       int acc, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;

    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);

    if (acc != 0) {
        check_dsp(ctx);
    }

    switch (opc) {
    case OPC_DIV:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv t3 = tcg_temp_new(tcg_ctx);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32s_tl(tcg_ctx, t1, t1);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t2, t0, INT_MIN);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, -1);
            tcg_gen_and_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
            tcg_gen_or_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_movi_tl(tcg_ctx, t3, 0);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t0, t1);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_LO[acc]);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], tcg_ctx->cpu_HI[acc]);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case OPC_DIVU:
        {
            TCGv t2 = tcg_const_tl(tcg_ctx, 0);
            TCGv t3 = tcg_const_tl(tcg_ctx, 1);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, t1, t1, t2, t3, t1);
            tcg_gen_divu_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t0, t1);
            tcg_gen_remu_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_LO[acc]);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], tcg_ctx->cpu_HI[acc]);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case OPC_MULT:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_muls2_i32(tcg_ctx, t2, t3, t2, t3);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t3);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
    case OPC_MULTU:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_mulu2_i32(tcg_ctx, t2, t3, t2, t3);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t3);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DDIV:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv t3 = tcg_temp_new(tcg_ctx);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t2, t0, -1LL << 63);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, -1LL);
            tcg_gen_and_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
            tcg_gen_or_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_movi_tl(tcg_ctx, t3, 0);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t0, t1);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t0, t1);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case OPC_DDIVU:
        {
            TCGv t2 = tcg_const_tl(tcg_ctx, 0);
            TCGv t3 = tcg_const_tl(tcg_ctx, 1);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, t1, t1, t2, t3, t1);
            tcg_gen_divu_i64(tcg_ctx, tcg_ctx->cpu_LO[acc], t0, t1);
            tcg_gen_remu_i64(tcg_ctx, tcg_ctx->cpu_HI[acc], t0, t1);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case OPC_DMULT:
        tcg_gen_muls2_i64(tcg_ctx, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc], t0, t1);
        break;
    case OPC_DMULTU:
        tcg_gen_mulu2_i64(tcg_ctx, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc], t0, t1);
        break;
#endif
    case OPC_MADD:
        {
            TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ext_tl_i64(tcg_ctx, t2, t0);
            tcg_gen_ext_tl_i64(tcg_ctx, t3, t1);
            tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
            tcg_gen_concat_tl_i64(tcg_ctx, t3, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc]);
            tcg_gen_add_i64(tcg_ctx, t2, t2, t3);
            tcg_temp_free_i64(tcg_ctx, t3);
            gen_move_low32(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            gen_move_high32(tcg_ctx, tcg_ctx->cpu_HI[acc], t2);
            tcg_temp_free_i64(tcg_ctx, t2);
        }
        break;
    case OPC_MADDU:
        {
            TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_extu_tl_i64(tcg_ctx, t2, t0);
            tcg_gen_extu_tl_i64(tcg_ctx, t3, t1);
            tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
            tcg_gen_concat_tl_i64(tcg_ctx, t3, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc]);
            tcg_gen_add_i64(tcg_ctx, t2, t2, t3);
            tcg_temp_free_i64(tcg_ctx, t3);
            gen_move_low32(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            gen_move_high32(tcg_ctx, tcg_ctx->cpu_HI[acc], t2);
            tcg_temp_free_i64(tcg_ctx, t2);
        }
        break;
    case OPC_MSUB:
        {
            TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ext_tl_i64(tcg_ctx, t2, t0);
            tcg_gen_ext_tl_i64(tcg_ctx, t3, t1);
            tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
            tcg_gen_concat_tl_i64(tcg_ctx, t3, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc]);
            tcg_gen_sub_i64(tcg_ctx, t2, t3, t2);
            tcg_temp_free_i64(tcg_ctx, t3);
            gen_move_low32(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            gen_move_high32(tcg_ctx, tcg_ctx->cpu_HI[acc], t2);
            tcg_temp_free_i64(tcg_ctx, t2);
        }
        break;
    case OPC_MSUBU:
        {
            TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_extu_tl_i64(tcg_ctx, t2, t0);
            tcg_gen_extu_tl_i64(tcg_ctx, t3, t1);
            tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
            tcg_gen_concat_tl_i64(tcg_ctx, t3, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc]);
            tcg_gen_sub_i64(tcg_ctx, t2, t3, t2);
            tcg_temp_free_i64(tcg_ctx, t3);
            gen_move_low32(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            gen_move_high32(tcg_ctx, tcg_ctx->cpu_HI[acc], t2);
            tcg_temp_free_i64(tcg_ctx, t2);
        }
        break;
    default:
        MIPS_INVAL("mul/div");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }
 out:
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}